

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

size_type __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
MemChunk::getUserSize(MemChunk *this)

{
  char cVar1;
  size_type sVar2;
  Exception *this_00;
  char diff;
  size_type chunkSize;
  MemChunk *this_local;
  
  sVar2 = getChunkSize(this);
  if ((this->m_size & 2) == 0) {
    this_local = (MemChunk *)(sVar2 - 0x10);
  }
  else {
    cVar1 = *(char *)((long)this + (sVar2 - 1));
    if (cVar1 < '\x01') {
      this_00 = (Exception *)__cxa_allocate_exception(0x10);
      Exception::Exception(this_00,MEM_ERROR_PADDING,"Invalid padding byte value");
      __cxa_throw(this_00,&Exception::typeinfo,0);
    }
    this_local = (MemChunk *)((sVar2 - 0x10) - (long)cVar1);
  }
  return (size_type)this_local;
}

Assistant:

inline size_type
        getUserSize () const
        {
            size_type chunkSize = getChunkSize ();
            if (m_size & BIT_NOTEXACTSIZE)
            {
                char diff = *((char*)(this) + chunkSize - 1);
                if (diff <= 0)
                {
                    throw Exception (MEM_ERROR_PADDING, "Invalid padding byte value");
                }
                return chunkSize - CHUNK_OVERHEAD - diff;
            }
            return chunkSize - CHUNK_OVERHEAD;
        }